

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_hexamine.cc
# Opt level: O2

int process_file(input_option *opt)

{
  char *filename;
  fdb_status fVar1;
  uint uVar2;
  filemgr_ops *pfVar3;
  ulong __size;
  ssize_t sVar4;
  undefined8 unaff_RBX;
  ulong uVar5;
  long lVar6;
  long lVar7;
  fdb_file_handle *dbfile;
  int local_113c;
  input_option *local_1138;
  fdb_config local_1130;
  uint8_t block_buf [4096];
  
  dbfile = (fdb_file_handle *)0x0;
  filename = opt->filename;
  fdb_get_default_config();
  local_1130.buffercache_size = 0;
  local_1130.flags = 2;
  pfVar3 = get_filemgr_ops();
  local_113c = (*pfVar3->open)(filename,2,0x1b6);
  if (local_113c < 0) {
LAB_0010412f:
    printf("\nUnable to open %s\n",filename);
  }
  else {
    __size = (*pfVar3->file_size)(filename);
    if (opt->print_header == true) {
      fVar1 = fdb_open(&dbfile,filename,&local_1130);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010412f;
      print_header(dbfile->root);
    }
    local_1138 = opt;
    if (opt->headers_only != true) {
      if (opt->max_filesize < __size) {
        printf("\n File %s size %lu exceeds max size of %lu \n",filename,__size);
      }
      else {
        db = (dblock *)malloc(__size);
        if (db != (dblock *)0x0) {
          lVar7 = 0;
          lVar6 = 0;
          uVar5 = 0;
          while( true ) {
            if (__size >> 0xc == uVar5) {
              uVar2 = getpid();
              printf("\nFile scanned and headers decoded\n gdb --pid=%d\n",(ulong)uVar2);
              do {
                gdb_sleep();
              } while( true );
            }
            sVar4 = (*pfVar3->pread)(local_113c,db->bytes + lVar6 + -0x54,0x1000,lVar7);
            if (sVar4 != 0x1000) break;
            if ((&db->marker)[lVar6] == 0xee) {
              printf("\nDB Header %lu",uVar5);
              decode_dblock(db->bytes + lVar6 + -0x54);
            }
            uVar5 = uVar5 + 1;
            lVar6 = lVar6 + 0x1010;
            lVar7 = lVar7 + 0x1000;
          }
          if (local_1138->print_header == true) {
            fdb_close(dbfile);
          }
          free(db);
          return -5;
        }
        printf("\nUnable to allocate memory of %lu bytes\n",__size);
      }
      if (opt->print_header == true) {
        fdb_close(dbfile);
        return -1;
      }
      return -1;
    }
    lVar6 = 0;
    for (uVar5 = 0; __size >> 0xc != uVar5; uVar5 = uVar5 + 1) {
      sVar4 = (*pfVar3->pread)(local_113c,(dblock *)block_buf,0x1000,lVar6);
      if (sVar4 != 0x1000) {
        fdb_close(dbfile);
        return -5;
      }
      db = (dblock *)block_buf;
      if ((uint8_t)((ulong)unaff_RBX >> 0x38) == 0xee) {
        printf("\n-------DB Header %lu at offset %lu--------",uVar5,lVar6);
        decode_dblock(db);
        printf("\ntrie_root_raw = %p",db->trie_root_raw);
        printf("\nseqtree_root_raw = %p",db->seqtree_root_raw);
        printf("\nnum_docs = %lu",db->num_docs);
        printf("\nnum_nodes = %lu",db->num_nodes);
        printf("\ndatasize = %lu",db->data_size);
        printf("\nlast_wal_flush_bid = %lu",db->last_wal_flush_bid);
        printf("\nkv_info_offset = %lu",db->kv_info_offset);
        printf("\nflags = %p",(db->field_9).hdr_flags);
        printf("\nnew_filename_len = %d",(ulong)db->new_filename_len);
        printf("\nold_filename_len = %d",(ulong)db->old_filename_len);
        printf("\ntrie_root_bid = %lu",db->trie_root_bid);
        printf("\ntrie_subblock_no = %lu",db->trie_subblock_no);
        printf("\ntrie_idx = %lu",db->trie_idx);
        printf("\nseqtree_root_bid = %lu",db->seqtree_root_bid);
        printf("\nseqtree_subblock_no = %lu",db->seqtree_subblock_no);
        printf("\nseqtree_idx = %lu",db->seqtree_idx);
        printf("\ndelta size = %lu",db->delta_size);
        printf("\nprev_hdr_bid = %lu",db->prev_hdr_bid);
        printf("\nhdr_len = %d",(ulong)db->hdr_len);
        printf("\nmagic = %p",(db->field_24).magic_bytes);
      }
      lVar6 = lVar6 + 0x1000;
    }
    if ((local_1138->print_header == true) &&
       (fVar1 = fdb_close(dbfile), fVar1 != FDB_RESULT_SUCCESS)) {
      printf("\nUnable to close %s\n",filename);
      return -4;
    }
    (*pfVar3->close)(local_113c);
  }
  return -1;
}

Assistant:

int process_file(struct input_option *opt)
{
    fdb_file_handle *dbfile = NULL;
    fdb_config config;
    char *filename = opt->filename;
    uint64_t file_size;
    size_t num_blocks;
    struct filemgr file;
    uint8_t block_buf[BLK_SIZE];
    fdb_status fs;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    config.flags = FDB_OPEN_FLAG_RDONLY;
    file.ops = get_filemgr_ops();
    file.fd = file.ops->open(filename, O_RDWR, 0666);

    if (file.fd < 0) {
        printf("\nUnable to open %s\n", filename);
        return -1;
    }

    file_size = file.ops->file_size(filename);
    num_blocks = file_size / BLK_SIZE;

    if (opt->print_header) {
        fs = fdb_open(&dbfile, filename, &config);
        if (fs != FDB_RESULT_SUCCESS) {
            printf("\nUnable to open %s\n", filename);
            return -1;
        }
        print_header(dbfile->root);
    }
    if (opt->headers_only) {
        for (uint64_t i = 0; i < num_blocks; ++i) {
            ssize_t rv = file.ops->pread(file.fd, &block_buf, BLK_SIZE,
                                          i * BLK_SIZE);
            if (rv != BLK_SIZE) {
                fdb_close(dbfile);
                return FDB_RESULT_READ_FAIL;
            }
            db = (dblock *)&block_buf;

            if (db->marker == DBHEADER_BLK) {
                printf("\n-------DB Header %" _F64 " at offset %" _F64
                        "--------" , i, i * BLK_SIZE);
                decode_dblock(db);
                printf("\ntrie_root_raw = %p", (void*)db->trie_root_raw);
                printf("\nseqtree_root_raw = %p", (void*)db->seqtree_root_raw);
                printf("\nnum_docs = %" _F64, db->num_docs);
                printf("\nnum_nodes = %" _F64, db->num_nodes);
                printf("\ndatasize = %" _F64, db->data_size);
                printf("\nlast_wal_flush_bid = %" _F64, db->last_wal_flush_bid);
                printf("\nkv_info_offset = %" _F64, db->kv_info_offset);
                printf("\nflags = %p", db->flags);
                printf("\nnew_filename_len = %d", db->new_filename_len);
                printf("\nold_filename_len = %d", db->old_filename_len);
                printf("\ntrie_root_bid = %" _F64, db->trie_root_bid);
                printf("\ntrie_subblock_no = %" _F64, db->trie_subblock_no);
                printf("\ntrie_idx = %" _F64, db->trie_idx);
                printf("\nseqtree_root_bid = %" _F64, db->seqtree_root_bid);
                printf("\nseqtree_subblock_no = %" _F64,
                                                 db->seqtree_subblock_no);
                printf("\nseqtree_idx = %" _F64, db->seqtree_idx);
                printf("\ndelta size = %" _F64, db->delta_size);
                printf("\nprev_hdr_bid = %" _F64, db->prev_hdr_bid);
                printf("\nhdr_len = %d", db->hdr_len);
                printf("\nmagic = %p", db->magic);
            }
        }

    } else {
        if (file_size > opt->max_filesize) {
            printf("\n File %s size %" _F64" exceeds max size of %" _F64" \n",
                    filename, file_size, opt->max_filesize);

            if (opt->print_header) {
                fdb_close(dbfile);
            }
            return -1;
        }

        db = (dblock *) malloc(file_size);
        if (!db) {
            printf("\nUnable to allocate memory of %" _F64" bytes\n",
            file_size);

            if (opt->print_header) {
                fdb_close(dbfile);
            }
            return -1;
        }
        for (uint64_t i = 0; i < num_blocks; ++i) {
            ssize_t rv = file.ops->pread(file.fd, &db[i], BLK_SIZE,
                    i * BLK_SIZE);
            if (rv != BLK_SIZE) {
                if (opt->print_header) {
                    fdb_close(dbfile);
                }
                free(db);
                return FDB_RESULT_READ_FAIL;
            }
            if (db[i].marker == DBHEADER_BLK) {
                printf("\nDB Header %" _F64, i);
                decode_dblock(&db[i]);
            }
        }
#if !defined(WIN32) && !defined(_WIN32)
        printf("\nFile scanned and headers decoded\n gdb --pid=%d\n", getpid());
#endif
        while (1) {
            gdb_sleep();
        }
        free(db);
    }

    if (opt->print_header) {
        fs = fdb_close(dbfile);
        if (fs != FDB_RESULT_SUCCESS) {
            printf("\nUnable to close %s\n", filename);
            return -4;
        }
    }

    file.ops->close(file.fd);

    return -1;
}